

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

int __thiscall presolve::HPresolve::link(HPresolve *this,char *__from,char *__to)

{
  HighsVarType HVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  HighsInt y;
  long lVar9;
  int iVar10;
  pointer piVar11;
  int *piVar12;
  pointer piVar13;
  int iVar14;
  char cVar15;
  int *piVar16;
  bool bVar17;
  HighsInt Nright;
  HighsInt Nleft;
  int local_40;
  int local_3c;
  pointer local_38;
  
  iVar10 = (int)__from;
  piVar8 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5[iVar10] = piVar11[piVar8[iVar10]];
  piVar6 = (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6[iVar10] = -1;
  piVar11[piVar8[iVar10]] = iVar10;
  lVar9 = (long)piVar5[iVar10];
  if (lVar9 != -1) {
    piVar6[lVar9] = iVar10;
  }
  piVar16 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar8[iVar10];
  *piVar16 = *piVar16 + 1;
  piVar5 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5[iVar10] = -1;
  piVar6 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar11 = piVar6 + iVar10;
  *piVar11 = -1;
  piVar13 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar13[iVar10];
  iVar14 = piVar7[iVar2];
  if (iVar14 == -1) {
    piVar5[iVar10] = -1;
  }
  else {
    iVar3 = piVar8[iVar10];
    piVar12 = &local_3c;
    local_3c = -1;
    piVar16 = &local_40;
    local_40 = -1;
    local_38 = piVar13;
    do {
      if (iVar3 < piVar8[iVar14]) {
        iVar4 = piVar5[iVar14];
        lVar9 = (long)iVar4;
        if (lVar9 == -1) goto LAB_0030c05f;
        if (iVar3 < piVar8[lVar9]) {
          piVar5[iVar14] = piVar6[lVar9];
          piVar6[lVar9] = iVar14;
          bVar17 = piVar5[lVar9] == -1;
          iVar14 = iVar4;
          if (bVar17) goto LAB_0030c067;
        }
        *piVar12 = iVar14;
        piVar12 = piVar5 + iVar14;
        iVar14 = *piVar12;
LAB_0030c01f:
        cVar15 = '\0';
      }
      else {
        if (iVar3 <= piVar8[iVar14]) break;
        iVar4 = piVar6[iVar14];
        lVar9 = (long)iVar4;
        if (lVar9 != -1) {
          if (piVar8[lVar9] < iVar3) {
            piVar6[iVar14] = piVar5[lVar9];
            piVar5[lVar9] = iVar14;
            bVar17 = piVar6[lVar9] == -1;
            iVar14 = iVar4;
            if (bVar17) {
LAB_0030c067:
              cVar15 = bVar17 * '\x03';
              goto LAB_0030c071;
            }
          }
          *piVar16 = iVar14;
          piVar16 = piVar6 + iVar14;
          iVar14 = *piVar16;
          goto LAB_0030c01f;
        }
LAB_0030c05f:
        cVar15 = '\x03';
      }
LAB_0030c071:
    } while (cVar15 == '\0');
    *piVar16 = piVar5[iVar14];
    *piVar12 = piVar6[iVar14];
    piVar5[iVar14] = local_40;
    piVar6[iVar14] = local_3c;
    piVar7[iVar2] = iVar14;
    piVar13 = local_38;
    if (piVar8[iVar10] < piVar8[iVar14]) {
      piVar5[iVar10] = piVar5[iVar14];
      *piVar11 = piVar7[iVar2];
      piVar11 = piVar5 + piVar7[iVar2];
    }
    else {
      piVar6[iVar10] = piVar6[iVar14];
      piVar5[iVar10] = piVar7[iVar2];
      piVar11 = piVar6 + piVar7[iVar2];
    }
  }
  *piVar11 = -1;
  piVar7[iVar2] = iVar10;
  HighsLinearSumBounds::add
            (&this->impliedRowBounds,piVar13[iVar10],piVar8[iVar10],
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar10]);
  HighsLinearSumBounds::add
            (&this->impliedDualRowBounds,
             (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar10],
             (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar10],
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar10]);
  piVar8 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar16 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar8[iVar10];
  *piVar16 = *piVar16 + 1;
  HVar1 = (this->model->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start
          [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar10]];
  if (HVar1 == kInteger) {
    lVar9 = 0x118;
  }
  else {
    if (HVar1 != kImplicitInteger) goto LAB_0030c17f;
    lVar9 = 0x130;
  }
  piVar8 = (pointer)(long)piVar8[iVar10];
  piVar16 = (int *)(*(long *)((long)&this->model + lVar9) + (long)piVar8 * 4);
  *piVar16 = *piVar16 + 1;
LAB_0030c17f:
  return (int)piVar8;
}

Assistant:

void HPresolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  ARleft[pos] = -1;
  ARright[pos] = -1;
  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);

  impliedRowBounds.add(Arow[pos], Acol[pos], Avalue[pos]);
  impliedDualRowBounds.add(Acol[pos], Arow[pos], Avalue[pos]);
  ++rowsize[Arow[pos]];
  if (model->integrality_[Acol[pos]] == HighsVarType::kInteger)
    ++rowsizeInteger[Arow[pos]];
  else if (model->integrality_[Acol[pos]] == HighsVarType::kImplicitInteger)
    ++rowsizeImplInt[Arow[pos]];
}